

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionDirWrapper.cpp
# Opt level: O0

void * __thiscall ExceptionEntryWrapper::getPtr(ExceptionEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  bufsize_t bVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BYTE *ptr;
  uint64_t myOffset;
  uint64_t firstOffset;
  void *first;
  size_t entrySize;
  ExceptionEntryWrapper *this_local;
  
  if (this->parentDir == (ExceptionDirWrapper *)0x0) {
    this_local = (ExceptionEntryWrapper *)0x0;
  }
  else {
    bVar3 = _getSize(this);
    iVar2 = (*(this->parentDir->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
    if ((CONCAT44(extraout_var,iVar2) == 0) || (bVar3 == 0)) {
      this_local = (ExceptionEntryWrapper *)0x0;
    }
    else {
      iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[6])(this,CONCAT44(extraout_var,iVar2),0);
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,CONCAT44(extraout_var_00,iVar2) +
                                (this->super_ExeNodeWrapper).entryNum * bVar3,1,bVar3,0);
      this_local = (ExceptionEntryWrapper *)CONCAT44(extraout_var_01,iVar2);
    }
  }
  return this_local;
}

Assistant:

void* ExceptionEntryWrapper::getPtr()
{
    if (!this->parentDir) {
        return NULL;
    }
    const size_t entrySize = _getSize();
    void* first = parentDir->getPtr();
    if (!first || !entrySize) {
        return NULL;
    }
    
    uint64_t firstOffset = this->getOffset(first);
    uint64_t myOffset = firstOffset + this->entryNum * entrySize;

    BYTE* ptr = m_Exe->getContentAt(myOffset, Executable::RAW, entrySize);
    return ptr;
}